

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall r_code::SysObject::trace(SysObject *this)

{
  vector<r_code::SysView_*> *this_00;
  ostream *poVar1;
  Atom *pAVar2;
  SysView **ppSVar3;
  ulong uVar4;
  size_t k;
  ulong uVar5;
  
  std::operator<<((ostream *)&std::cout,"\n---object---\n");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"code size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"reference set size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"marker set size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"view set size: ");
  this_00 = &this->views;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"\n---code---\n");
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->super_ImageObject).code.m_vector.
                            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).code.m_vector.
                            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1," ");
    pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,uVar5);
    Atom::trace(pAVar2);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"\n---reference set---\n");
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->super_ImageObject).references.m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar1 = std::operator<<(poVar1," ");
    vector<unsigned_int>::operator[](&(this->super_ImageObject).references,uVar5);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::operator<<((ostream *)&std::cout,"\n---marker set---\n");
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->markers).m_vector.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar1 = std::operator<<(poVar1," ");
    vector<unsigned_int>::operator[](&this->markers,uVar5);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::operator<<((ostream *)&std::cout,"\n---view set---\n");
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(this->views).m_vector.
                            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->views).m_vector.
                            super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"view[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"]");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"reference set size: ");
    vector<r_code::SysView_*>::operator[](this_00,uVar5);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"-code-");
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar4 = 0;
    while( true ) {
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,uVar5);
      if ((ulong)((long)((*ppSVar3)->super_ImageObject).code.m_vector.
                        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)((*ppSVar3)->super_ImageObject).code.m_vector.
                        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar4) break;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar1," ");
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,uVar5);
      pAVar2 = vector<r_code::Atom>::operator[](&((*ppSVar3)->super_ImageObject).code,uVar4);
      Atom::trace(pAVar2);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      uVar4 = uVar4 + 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"-reference set-");
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar4 = 0;
    while( true ) {
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,uVar5);
      if ((ulong)((long)((*ppSVar3)->super_ImageObject).references.m_vector.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)((*ppSVar3)->super_ImageObject).references.m_vector.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar4) break;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar1 = std::operator<<(poVar1," ");
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,uVar5);
      vector<unsigned_int>::operator[](&((*ppSVar3)->super_ImageObject).references,uVar4);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      uVar4 = uVar4 + 1;
    }
  }
  return;
}

Assistant:

void SysObject::trace()
{
    std::cout << "\n---object---\n";
    std::cout << oid << std::endl;
    std::cout << "code size: " << code.size() << std::endl;
    std::cout << "reference set size: " << references.size() << std::endl;
    std::cout << "marker set size: " << markers.size() << std::endl;
    std::cout << "view set size: " << views.size() << std::endl;
    std::cout << "\n---code---\n";
    size_t i;

    for (i = 0; i < code.size(); ++i) {
        std::cout << i << " ";
        code[i].trace();
        std::cout << std::endl;
    }

    std::cout << "\n---reference set---\n";

    for (i = 0; i < references.size(); ++i) {
        std::cout << i << " " << references[i] << std::endl;
    }

    std::cout << "\n---marker set---\n";

    for (i = 0; i < markers.size(); ++i) {
        std::cout << i << " " << markers[i] << std::endl;
    }

    std::cout << "\n---view set---\n";

    for (size_t k = 0; k < views.size(); ++k) {
        std::cout << "view[" << k << "]" << std::endl;
        std::cout << "reference set size: " << views[k]->references.size() << std::endl;
        std::cout << "-code-" << std::endl;
        size_t j;

        for (j = 0; j < views[k]->code.size(); ++i, ++j) {
            std::cout << j << " ";
            views[k]->code[j].trace();
            std::cout << std::endl;
        }

        std::cout << "-reference set-" << std::endl;

        for (j = 0; j < views[k]->references.size(); ++i, ++j) {
            std::cout << j << " " << views[k]->references[j] << std::endl;
        }
    }
}